

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d.h
# Opt level: O3

int __thiscall TNT::Array2D<double>::copy(Array2D<double> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  double **ppdVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  
  Array2D(this,*(int *)(dst + 0x40),*(int *)(dst + 0x44));
  iVar1 = *(int *)(dst + 0x40);
  if (0 < (long)iVar1) {
    uVar2 = *(uint *)(dst + 0x44);
    lVar3 = *(long *)(dst + 0x38);
    ppdVar4 = (this->v_).data_;
    lVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar5 = *(long *)(lVar3 + lVar7 * 8);
        pdVar6 = ppdVar4[lVar7];
        uVar8 = 0;
        do {
          pdVar6[uVar8] = *(double *)(lVar5 + uVar8 * 8);
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return (int)this;
}

Assistant:

Array2D<T> Array2D<T>::copy() const
{
	Array2D A(m_, n_);

	for (int i=0; i<m_; i++)
		for (int j=0; j<n_; j++)
			A[i][j] = v_[i][j];


	return A;
}